

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::init
          (ShaderTextureFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  tcu *ptVar1;
  bool bVar2;
  int iVar3;
  float *pfVar4;
  Vec4 *b_00;
  Vec3 *b_01;
  EVP_PKEY_CTX *ctx_00;
  Vec3 *a;
  float fVar5;
  byte local_2d9;
  Matrix<float,_4,_4> local_278;
  Matrix<float,_4,_4> local_238;
  float local_1f8;
  float local_1f4;
  float gradDyTrans [16];
  float gradDxTrans [16];
  tcu local_170 [8];
  Vec3 sy;
  Vec3 sx;
  undefined1 auStack_118 [8];
  float lodCoordTrans [16];
  float b_1;
  float s_1;
  bool isGrad;
  bool hasLodBias;
  Matrix<float,_4,_4> local_b8;
  float local_78 [2];
  float baseCoordTrans [16];
  undefined1 local_30 [8];
  Vec4 b;
  Vec4 s;
  ShaderTextureFunctionCase *this_local;
  
  b_00 = &(this->m_lookupSpec).minCoord;
  ptVar1 = (tcu *)(b.m_data + 2);
  tcu::operator-(ptVar1,&(this->m_lookupSpec).maxCoord,b_00);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_30,b_00);
  pfVar4 = tcu::Vector<float,_4>::x((Vector<float,_4> *)ptVar1);
  local_78[0] = *pfVar4;
  local_78[1] = 0.0;
  baseCoordTrans[0] = 0.0;
  pfVar4 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_30);
  baseCoordTrans[1] = *pfVar4;
  baseCoordTrans[2] = 0.0;
  pfVar4 = tcu::Vector<float,_4>::y((Vector<float,_4> *)ptVar1);
  baseCoordTrans[3] = *pfVar4;
  baseCoordTrans[4] = 0.0;
  pfVar4 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_30);
  baseCoordTrans[5] = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)ptVar1);
  baseCoordTrans[6] = *pfVar4 * 0.5;
  pfVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)ptVar1);
  baseCoordTrans[7] = -*pfVar4 * 0.5;
  baseCoordTrans[8] = 0.0;
  pfVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)ptVar1);
  fVar5 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_30);
  baseCoordTrans[9] = fVar5 * 0.5 + *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)ptVar1);
  baseCoordTrans[10] = -*pfVar4 * 0.5;
  pfVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)ptVar1);
  baseCoordTrans[0xb] = *pfVar4 * 0.5;
  baseCoordTrans[0xc] = 0.0;
  pfVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)ptVar1);
  fVar5 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_30);
  baseCoordTrans[0xd] = fVar5 * 0.5 + *pfVar4;
  ctx_00 = (EVP_PKEY_CTX *)&local_b8;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)ctx_00,local_78);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
            (&(this->super_ShaderRenderCase).m_userAttribTransforms,(value_type *)ctx_00);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_b8);
  bVar2 = anon_unknown_1::functionHasLod((this->m_lookupSpec).function);
  local_2d9 = 1;
  if (!bVar2) {
    local_2d9 = (this->m_lookupSpec).useBias;
  }
  bVar2 = anon_unknown_1::functionHasGrad((this->m_lookupSpec).function);
  if ((local_2d9 & 1) == 0) {
    if (bVar2) {
      b_01 = &(this->m_lookupSpec).minDX;
      ptVar1 = (tcu *)(sy.m_data + 1);
      tcu::operator-(ptVar1,&(this->m_lookupSpec).maxDX,b_01);
      a = &(this->m_lookupSpec).maxDY;
      tcu::operator-(local_170,a,&(this->m_lookupSpec).minDY);
      pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)ptVar1);
      gradDyTrans[0xe] = *pfVar4 * 0.5;
      pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)ptVar1);
      gradDyTrans[0xf] = *pfVar4 * 0.5;
      tcu::Vector<float,_3>::x(b_01);
      tcu::Vector<float,_3>::y((Vector<float,_3> *)ptVar1);
      tcu::Vector<float,_3>::y((Vector<float,_3> *)ptVar1);
      tcu::Vector<float,_3>::y(b_01);
      tcu::Vector<float,_3>::z((Vector<float,_3> *)ptVar1);
      tcu::Vector<float,_3>::z((Vector<float,_3> *)ptVar1);
      tcu::Vector<float,_3>::z(b_01);
      pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_170);
      local_1f8 = *pfVar4 * -0.5;
      pfVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_170);
      local_1f4 = *pfVar4 * -0.5;
      gradDyTrans[0] = 0.0;
      pfVar4 = tcu::Vector<float,_3>::x(a);
      gradDyTrans[1] = *pfVar4;
      pfVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_170);
      gradDyTrans[2] = *pfVar4 * -0.5;
      pfVar4 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_170);
      gradDyTrans[3] = *pfVar4 * -0.5;
      gradDyTrans[4] = 0.0;
      pfVar4 = tcu::Vector<float,_3>::y(a);
      gradDyTrans[5] = *pfVar4;
      pfVar4 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_170);
      gradDyTrans[6] = *pfVar4 * -0.5;
      pfVar4 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_170);
      gradDyTrans[7] = *pfVar4 * -0.5;
      gradDyTrans[8] = 0.0;
      pfVar4 = tcu::Vector<float,_3>::z(a);
      gradDyTrans[9] = *pfVar4;
      gradDyTrans[10] = 0.0;
      gradDyTrans[0xb] = 0.0;
      gradDyTrans[0xc] = 0.0;
      gradDyTrans[0xd] = 0.0;
      tcu::Matrix<float,_4,_4>::Matrix(&local_238,gradDyTrans + 0xe);
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                (&(this->super_ShaderRenderCase).m_userAttribTransforms,&local_238);
      tcu::Matrix<float,_4,_4>::~Matrix(&local_238);
      ctx_00 = (EVP_PKEY_CTX *)&local_278;
      tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)ctx_00,&local_1f8);
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                (&(this->super_ShaderRenderCase).m_userAttribTransforms,(value_type *)ctx_00);
      tcu::Matrix<float,_4,_4>::~Matrix(&local_278);
    }
  }
  else {
    fVar5 = (this->m_lookupSpec).maxLodBias - (this->m_lookupSpec).minLodBias;
    lodCoordTrans._8_16_ = ZEXT416(0);
    auStack_118._4_4_ = fVar5 * 0.5;
    auStack_118._0_4_ = fVar5 * 0.5;
    lodCoordTrans[0] = 0.0;
    lodCoordTrans[1] = (this->m_lookupSpec).minLodBias;
    ctx_00 = (EVP_PKEY_CTX *)(sx.m_data + 1);
    lodCoordTrans._24_16_ = lodCoordTrans._8_16_;
    lodCoordTrans._40_16_ = lodCoordTrans._8_16_;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)ctx_00,(float *)auStack_118);
    std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
              (&(this->super_ShaderRenderCase).m_userAttribTransforms,(value_type *)ctx_00);
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)(sx.m_data + 1));
  }
  initShaderSources(this);
  initTexture(this);
  iVar3 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx_00);
  return iVar3;
}

Assistant:

void ShaderTextureFunctionCase::init (void)
{
	{
		// Base coord scale & bias
		Vec4 s = m_lookupSpec.maxCoord-m_lookupSpec.minCoord;
		Vec4 b = m_lookupSpec.minCoord;

		float baseCoordTrans[] =
		{
			s.x(),		0.0f,		0.f,	b.x(),
			0.f,		s.y(),		0.f,	b.y(),
			s.z()/2.f,	-s.z()/2.f,	0.f,	s.z()/2.f + b.z(),
			-s.w()/2.f,	s.w()/2.f,	0.f,	s.w()/2.f + b.w()
		};

		m_userAttribTransforms.push_back(tcu::Mat4(baseCoordTrans));
	}

	bool hasLodBias	= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	bool isGrad		= functionHasGrad(m_lookupSpec.function);
	DE_ASSERT(!isGrad || !hasLodBias);

	if (hasLodBias)
	{
		float s = m_lookupSpec.maxLodBias-m_lookupSpec.minLodBias;
		float b = m_lookupSpec.minLodBias;
		float lodCoordTrans[] =
		{
			s/2.0f,		s/2.0f,		0.f,	b,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(lodCoordTrans));
	}
	else if (isGrad)
	{
		Vec3 sx = m_lookupSpec.maxDX-m_lookupSpec.minDX;
		Vec3 sy = m_lookupSpec.maxDY-m_lookupSpec.minDY;
		float gradDxTrans[] =
		{
			sx.x()/2.0f,	sx.x()/2.0f,	0.f,	m_lookupSpec.minDX.x(),
			sx.y()/2.0f,	sx.y()/2.0f,	0.0f,	m_lookupSpec.minDX.y(),
			sx.z()/2.0f,	sx.z()/2.0f,	0.0f,	m_lookupSpec.minDX.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};
		float gradDyTrans[] =
		{
			-sy.x()/2.0f,	-sy.x()/2.0f,	0.f,	m_lookupSpec.maxDY.x(),
			-sy.y()/2.0f,	-sy.y()/2.0f,	0.0f,	m_lookupSpec.maxDY.y(),
			-sy.z()/2.0f,	-sy.z()/2.0f,	0.0f,	m_lookupSpec.maxDY.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(gradDxTrans));
		m_userAttribTransforms.push_back(tcu::Mat4(gradDyTrans));
	}

	initShaderSources();
	initTexture();

	gls::ShaderRenderCase::init();
}